

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

void __thiscall CVmRun::push_stringvf(CVmRun *this,char *fmt,__va_list_tag *args)

{
  char *__ptr;
  char *in_RDX;
  CVmRun *in_RSI;
  char *str;
  __va_list_tag *in_stack_ffffffffffffffe0;
  
  __ptr = t3vsprintf_alloc(in_RDX,in_stack_ffffffffffffffe0);
  push_string(in_RSI,in_RDX);
  free(__ptr);
  return;
}

Assistant:

void CVmRun::push_stringvf(VMG_ const char *fmt, va_list args)
{
    /* allocate and format the string */
    char *str = t3vsprintf_alloc(fmt, args);

    /* push it */
    push_string(vmg_ str);

    /* free the allocated string buffer */
    t3free(str);
}